

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void pstore::create_log_stream(string *ident)

{
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *__first;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *__last;
  long lVar1;
  tuple<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  this;
  __single_object _Var2;
  bool bVar3;
  logger *plVar4;
  size_type __n;
  pointer __result;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *puVar5;
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *pbVar6;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *puVar7;
  long *in_FS_OFFSET;
  file_system_traits local_7a;
  fstream_traits local_79;
  __single_object loggers;
  bitset<4UL> enabled;
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  enabled.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  std::bitset<4UL>::set(&enabled,3,true);
  std::
  make_unique<std::vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>>
            ();
  std::
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  ::reserve((vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
             *)loggers._M_t.
               super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
               ._M_head_impl,POPCOUNT(enabled.super__Base_bitset<1UL>._M_w));
  bVar3 = std::bitset<4UL>::test(&enabled,3);
  _Var2 = loggers;
  if (bVar3) {
    plVar4 = (logger *)operator_new(0x68);
    (plVar4->buffer_)._M_dataplus._M_p = (pointer)&(plVar4->buffer_).field_2;
    (plVar4->buffer_)._M_string_length = 0;
    (plVar4->buffer_).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)&plVar4->priority_ = 0x800000007;
    plVar4->_vptr_logger = (_func_int **)&PTR__logger_0025e908;
    plVar4[1]._vptr_logger = (_func_int **)0x0;
    plVar4[1].buffer_._M_dataplus._M_p = (pointer)0x0;
    plVar4[1].buffer_._M_string_length = 0;
    plVar4[1].buffer_.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&plVar4[1].buffer_.field_2 + 8) = 0;
    *(undefined8 *)&plVar4[1].priority_ = 0;
    *(undefined2 *)&plVar4[2]._vptr_logger = 0;
    strncpy((char *)(plVar4 + 1),(ident->_M_dataplus)._M_p,0x31);
    *(undefined1 *)((long)&plVar4[2]._vptr_logger + 1) = 0;
    openlog((char *)(plVar4 + 1),1,8);
    puVar7 = *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)
              ((long)_Var2._M_t.
                     super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                     ._M_head_impl + 8);
    if (puVar7 == *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)
                   ((long)_Var2._M_t.
                          super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                          ._M_head_impl + 0x10)) {
      __n = std::
            vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
            ::_M_check_len((vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                            *)_Var2._M_t.
                              super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                              ._M_head_impl,1,"vector::_M_realloc_insert");
      __first = *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)
                 _Var2._M_t.
                 super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                 ._M_head_impl;
      __last = *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)
                ((long)_Var2._M_t.
                       super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                       ._M_head_impl + 8);
      __result = std::
                 _Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                 ::_M_allocate((_Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                                *)_Var2._M_t.
                                  super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                                  ._M_head_impl,__n);
      *(logger **)((long)__result + ((long)puVar7 - (long)__first)) = plVar4;
      puVar5 = std::
               __relocate_a_1<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>*,std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>*,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
                         (__first,puVar7,__result,
                          (allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>
                           *)_Var2._M_t.
                             super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                             ._M_head_impl);
      puVar7 = std::
               __relocate_a_1<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>*,std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>*,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
                         (puVar7,__last,puVar5 + 1,
                          (allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>
                           *)_Var2._M_t.
                             super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                             ._M_head_impl);
      std::
      _Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
      ::_M_deallocate((_Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                       *)_Var2._M_t.
                         super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                         ._M_head_impl,__first,
                      *(long *)((long)_Var2._M_t.
                                      super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                                      ._M_head_impl + 0x10) - (long)__first >> 3);
      *(pointer *)
       _Var2._M_t.
       super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
       .
       super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
       ._M_head_impl = __result;
      *(pointer *)
       ((long)_Var2._M_t.
              super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
              .
              super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
              ._M_head_impl + 0x10) = __result + __n;
    }
    else {
      (puVar7->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl = plVar4;
      puVar7 = (unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *)
               (*(long *)((long)_Var2._M_t.
                                super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                                .
                                super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                                ._M_head_impl + 8) + 8);
    }
    *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)
     ((long)_Var2._M_t.
            super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
            .
            super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
            ._M_head_impl + 8) = puVar7;
  }
  bVar3 = std::bitset<4UL>::test(&enabled,1);
  _Var2 = loggers;
  if (bVar3) {
    pbVar6 = (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *)
             operator_new(0x288);
    std::operator+(&local_50,ident,".log");
    basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits>::basic_rotating_log
              (pbVar6,&local_50,0x100000,10,&local_79,&local_7a);
    local_58 = pbVar6;
    std::
    vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
    ::emplace_back<pstore::basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits>*>
              ((vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
                *)_Var2._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                  ._M_head_impl,&local_58);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar3 = std::bitset<4UL>::test(&enabled,2);
  _Var2 = loggers;
  if (bVar3) {
    pbVar6 = (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *)
             operator_new(0x58);
    stderr_logger::stderr_logger((stderr_logger *)pbVar6);
    local_58 = pbVar6;
    std::
    vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
    ::emplace_back<pstore::stderr_logger*>
              ((vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
                *)_Var2._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                  ._M_head_impl,(stderr_logger **)&local_58);
  }
  lVar1 = *in_FS_OFFSET;
  this.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
         *)&((_Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
              *)(lVar1 + -8))->
            super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  ;
  if (this.
      super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
      .
      super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
      ._M_head_impl !=
      (_Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
       )0x0) {
    std::
    vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    ::~vector((vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
               *)this.
                 super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                 ._M_head_impl);
  }
  operator_delete((void *)this.
                          super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
                          ._M_head_impl,0x18);
  _Var2 = loggers;
  loggers._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
          )0x0;
  ((_Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
    *)(lVar1 + -8))->
  super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
       = (_Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
          )_Var2._M_t.
           super___uniq_ptr_impl<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
           .
           super__Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
           ._M_head_impl;
  std::
  unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  ::~unique_ptr(&loggers);
  return;
}

Assistant:

void create_log_stream (std::string const & ident) {
            std::bitset<handlers::last> enabled;

#ifdef PSTORE_HAVE_OSLOG_H
            enabled.set (handlers::asl);
#elif defined(PSTORE_HAVE_SYS_LOG_H)
            enabled.set (handlers::syslog);
#else
            // TODO: At the moment, I just log to stderr unless syslog() or ASL are available.
            // Consider offering an option to the user to control the logging destination and
            // whether to use file-base logging.
            enabled.set (handlers::standard_error);
#endif

            auto loggers = std::make_unique<details::logger_collection> ();
            loggers->reserve (enabled.count ());

#ifdef PSTORE_HAVE_OSLOG_H
            if (enabled.test (handlers::asl)) {
                loggers->emplace_back (new asl_logger (ident));
            }
#endif
#ifdef PSTORE_HAVE_SYS_LOG_H
            if (enabled.test (handlers::syslog)) {
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                loggers->emplace_back (new syslog_logger (ident, LOG_USER));
            }
#endif

            if (enabled.test (handlers::rotating_file)) {
                constexpr auto max_size = std::streamoff{1024 * 1024};
                constexpr auto num_backups = 10U;
                loggers->emplace_back (new rotating_log (ident + ".log", max_size, num_backups));
            }

            if (enabled.test (handlers::standard_error)) {
                loggers->emplace_back (new stderr_logger);
            }

            using details::log_destinations;
            delete log_destinations;
            log_destinations = loggers.release ();
        }